

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int get_num_opt(archive_write *a,int *num,int high,int low,char *key,char *value)

{
  int iVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  undefined4 in_register_0000000c;
  byte *pbVar5;
  undefined8 uVar6;
  undefined4 in_register_00000014;
  char *pcVar7;
  uint uVar8;
  byte bVar9;
  
  pcVar7 = (char *)CONCAT44(in_register_0000000c,low);
  if (pcVar7 == (char *)0x0) {
    pcVar7 = "Invalid value(empty) for option ``%s\'\'";
LAB_0051c65e:
    archive_set_error(&a->archive,-1,pcVar7,CONCAT44(in_register_00000014,high),
                      CONCAT44(in_register_00000014,high),value);
LAB_0051c69a:
    iVar3 = -0x1e;
  }
  else {
    cVar2 = *pcVar7;
    bVar9 = pcVar7[cVar2 == '-'];
    iVar3 = 0;
    uVar8 = 0;
    if (bVar9 != 0) {
      pbVar5 = (byte *)(pcVar7 + (cVar2 == '-'));
      value = (char *)0x0;
      do {
        pbVar5 = pbVar5 + 1;
        if (9 < (byte)(bVar9 - 0x30)) {
          pcVar7 = "Invalid value for option ``%s\'\'";
          goto LAB_0051c65e;
        }
        iVar1 = (uint)bVar9 + (int)value * 10;
        if (0x1002f < iVar1) {
          pcVar7 = "Invalid value(over %d) for option ``%s\'\'";
          uVar6 = 0xffff;
LAB_0051c693:
          archive_set_error(&a->archive,-1,pcVar7,uVar6);
          goto LAB_0051c69a;
        }
        if (iVar1 < 0x31) {
          pcVar7 = "Invalid value(under %d) for option ``%s\'\'";
          uVar6 = 1;
          goto LAB_0051c693;
        }
        uVar8 = iVar1 - 0x30;
        value = (char *)(ulong)uVar8;
        bVar9 = *pbVar5;
      } while (bVar9 != 0);
    }
    uVar4 = -uVar8;
    if (cVar2 != '-') {
      uVar4 = uVar8;
    }
    *num = uVar4;
  }
  return iVar3;
}

Assistant:

static int
get_num_opt(struct archive_write *a, int *num, int high, int low,
    const char *key, const char *value)
{
	const char *p = value;
	int data = 0;
	int neg = 0;

	if (p == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Invalid value(empty) for option ``%s''", key);
		return (ARCHIVE_FATAL);
	}
	if (*p == '-') {
		neg = 1;
		p++;
	}
	while (*p) {
		if (*p >= '0' && *p <= '9')
			data = data * 10 + *p - '0';
		else {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Invalid value for option ``%s''", key);
			return (ARCHIVE_FATAL);
		}
		if (data > high) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Invalid value(over %d) for "
			    "option ``%s''", high, key);
			return (ARCHIVE_FATAL);
		}
		if (data < low) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Invalid value(under %d) for "
			    "option ``%s''", low, key);
			return (ARCHIVE_FATAL);
		}
		p++;
	}
	if (neg)
		data *= -1;
	*num = data;

	return (ARCHIVE_OK);
}